

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

void leveldb::BM_LogAndApply(int iters,int num_base_files)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint num;
  uint num_00;
  uint num_01;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  uint64_t file;
  string *this;
  leveldb *this_00;
  long *plVar5;
  char *pcVar6;
  char *in_R9;
  ulong uVar7;
  bool bVar8;
  bool save_manifest;
  ulong local_5b8;
  DB *db;
  uint local_5a8;
  uint local_5a4;
  Env *local_5a0;
  InternalKey limit;
  Status s;
  InternalKey limit_1;
  string local_538;
  undefined1 local_518 [16];
  Version *pVStack_508;
  InternalKeyComparator cmp;
  leveldb local_4f0 [8];
  Mutex mu;
  string dbname;
  char buf [16];
  VersionEdit vbase;
  Options options;
  VersionSet vset;
  Options opts;
  
  testing::TempDir_abi_cxx11_();
  std::operator+(&dbname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vset,
                 "leveldb_test_benchmark");
  std::__cxx11::string::_M_dispose();
  Options::Options((Options *)&vset);
  DestroyDB(local_4f0,&dbname,(Options *)&vset);
  Status::~Status((Status *)local_4f0);
  db = (DB *)0x0;
  Options::Options(&opts);
  opts.create_if_missing = true;
  DB::Open((DB *)&s,&opts,&dbname,&db);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&vset,(char *)&vbase,
             (Status *)0x16e02a);
  if ((char)vset.env_ == '\0') {
    testing::Message::Message((Message *)&vbase);
    if (vset.dbname_._M_dataplus._M_p == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)vset.dbname_._M_dataplus._M_p;
    }
    this = &vset.dbname_;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)buf,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x8c9,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)buf,(Message *)&vbase);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)buf);
    plVar5 = (long *)CONCAT71(vbase.comparator_._M_dataplus._M_p._1_7_,
                              (char)vbase.comparator_._M_dataplus._M_p);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&vset.dbname_);
    this = (string *)&vbase.comparator_._M_string_length;
    vbase.comparator_._M_string_length = 0;
    vbase.comparator_._M_dataplus._M_p._0_1_ = db != (DB *)0x0;
    if ((bool)(char)vbase.comparator_._M_dataplus._M_p) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this);
      if (db != (DB *)0x0) {
        (*db->_vptr_DB[1])();
      }
      db = (DB *)0x0;
      local_5a0 = Env::Default();
      mu.mu_.super___mutex_base._M_mutex._16_8_ = 0;
      mu.mu_.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
      mu.mu_.super___mutex_base._M_mutex.__align = 0;
      mu.mu_.super___mutex_base._M_mutex._8_8_ = 0;
      mu.mu_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
      std::mutex::lock(&mu.mu_);
      cmp.user_comparator_ = BytewiseComparator();
      cmp.super_Comparator._vptr_Comparator = (_func_int **)&PTR__Comparator_00196730;
      Options::Options(&options);
      VersionSet::VersionSet(&vset,&dbname,&options,(TableCache *)0x0,&cmp);
      VersionSet::Recover((VersionSet *)buf,(bool *)&vset);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&vbase,(char *)&limit,
                 (Status *)"vset.Recover(&save_manifest)");
      Status::~Status((Status *)buf);
      if ((char)vbase.comparator_._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)buf);
        if (vbase.comparator_._M_string_length == 0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)vbase.comparator_._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&limit,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                   ,0x8d8,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)&limit,(Message *)buf);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&limit);
        if ((long *)CONCAT71(buf._1_7_,buf[0]) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(buf._1_7_,buf[0]) + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&vbase.comparator_._M_string_length);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&vbase.comparator_._M_string_length);
        VersionEdit::VersionEdit(&vbase);
        uVar7 = 0;
        if (0 < num_base_files) {
          uVar7 = (ulong)(uint)num_base_files;
        }
        local_5b8 = 0;
        if (0 < iters) {
          local_5b8 = (ulong)(uint)iters;
        }
        iVar3 = (int)uVar7;
        this_00 = (leveldb *)0x2;
        uVar4 = extraout_RDX;
        file = 1;
        local_5a8 = num_base_files;
        local_5a4 = iters;
        while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
          MakeKey_abi_cxx11_(&limit.rep_,this_00,(uint)uVar4);
          limit_1.rep_._M_dataplus = limit.rep_._M_dataplus;
          limit_1.rep_._M_string_length = limit.rep_._M_string_length;
          InternalKey::InternalKey((InternalKey *)buf,(Slice *)&limit_1.rep_,1,kTypeValue);
          std::__cxx11::string::_M_dispose();
          MakeKey_abi_cxx11_(&limit_1.rep_,(leveldb *)(ulong)((int)this_00 + 1),num);
          local_538._M_dataplus._M_p = limit_1.rep_._M_dataplus._M_p;
          local_538._M_string_length = limit_1.rep_._M_string_length;
          InternalKey::InternalKey((InternalKey *)&limit.rep_,(Slice *)&local_538,1,kTypeDeletion);
          std::__cxx11::string::_M_dispose();
          VersionEdit::AddFile(&vbase,2,file,1,(InternalKey *)buf,(InternalKey *)&limit.rep_);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          this_00 = (leveldb *)(ulong)((int)this_00 + 2);
          uVar4 = extraout_RDX_00;
          file = file + 1;
        }
        VersionSet::LogAndApply((VersionSet *)&limit,(VersionEdit *)&vset,(Mutex *)&vbase);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)buf,(char *)&limit_1
                   ,(Status *)"vset.LogAndApply(&vbase, &mu)");
        Status::~Status((Status *)&limit);
        if (buf[0] == '\0') {
          testing::Message::Message((Message *)&limit);
          if (buf._8_8_ == 0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = *(char **)buf._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&limit_1,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                     ,0x8e0,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)&limit_1,(Message *)&limit);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&limit_1);
          if (limit.rep_._M_dataplus._M_p != (pointer)0x0) {
            (**(code **)(*(long *)limit.rep_._M_dataplus._M_p + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(buf + 8));
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(buf + 8));
          iVar2 = (*local_5a0->_vptr_Env[0x15])();
          uVar7 = (ulong)(iVar3 + 1);
          uVar1 = iVar3 * 2;
          while( true ) {
            bVar8 = local_5b8 == 0;
            local_5b8 = local_5b8 - 1;
            if (bVar8) break;
            VersionEdit::VersionEdit((VersionEdit *)buf);
            VersionEdit::RemoveFile((VersionEdit *)buf,2,uVar7);
            MakeKey_abi_cxx11_(&limit_1.rep_,(leveldb *)(ulong)(uVar1 + 2),num_00);
            local_538._M_dataplus._M_p = limit_1.rep_._M_dataplus._M_p;
            local_538._M_string_length = limit_1.rep_._M_string_length;
            InternalKey::InternalKey(&limit,(Slice *)&local_538,1,kTypeValue);
            std::__cxx11::string::_M_dispose();
            MakeKey_abi_cxx11_(&local_538,(leveldb *)(ulong)(uVar1 + 3),num_01);
            local_518._8_8_ = local_538._M_dataplus._M_p;
            pVStack_508 = (Version *)local_538._M_string_length;
            InternalKey::InternalKey
                      ((InternalKey *)&limit_1.rep_,(Slice *)(local_518 + 8),1,kTypeDeletion);
            std::__cxx11::string::_M_dispose();
            VersionEdit::AddFile((VersionEdit *)buf,2,uVar7,1,&limit,(InternalKey *)&limit_1.rep_);
            VersionSet::LogAndApply((VersionSet *)local_518,(VersionEdit *)&vset,(Mutex *)buf);
            Status::~Status((Status *)local_518);
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            VersionEdit::~VersionEdit((VersionEdit *)buf);
            uVar7 = uVar7 + 1;
            uVar1 = uVar1 + 2;
          }
          iVar3 = (*local_5a0->_vptr_Env[0x15])();
          snprintf(buf,0x10,"%d",(ulong)local_5a8);
          fprintf(_stderr,"BM_LogAndApply/%-6s   %8d iters : %9u us (%7.0f us / iter)\n",
                  SUB84((double)((float)(uint)(iVar3 - iVar2) / (float)(int)local_5a4),0),buf,
                  (ulong)local_5a4,(ulong)(uint)(iVar3 - iVar2));
        }
        VersionEdit::~VersionEdit(&vbase);
      }
      VersionSet::~VersionSet(&vset);
      Comparator::~Comparator(&cmp.super_Comparator);
      pthread_mutex_unlock((pthread_mutex_t *)&mu);
      goto LAB_001260ec;
    }
    testing::Message::Message((Message *)buf);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vset,(internal *)&vbase,(AssertionResult *)"db != nullptr","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&options,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x8ca,(char *)CONCAT71(vset.env_._1_7_,(char)vset.env_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&options,(Message *)buf);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&options);
    std::__cxx11::string::_M_dispose();
    plVar5 = (long *)CONCAT71(buf._1_7_,buf[0]);
  }
  if (plVar5 != (long *)0x0) {
    (**(code **)(*plVar5 + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this);
LAB_001260ec:
  Status::~Status(&s);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void BM_LogAndApply(int iters, int num_base_files) {
  std::string dbname = testing::TempDir() + "leveldb_test_benchmark";
  DestroyDB(dbname, Options());

  DB* db = nullptr;
  Options opts;
  opts.create_if_missing = true;
  Status s = DB::Open(opts, dbname, &db);
  ASSERT_LEVELDB_OK(s);
  ASSERT_TRUE(db != nullptr);

  delete db;
  db = nullptr;

  Env* env = Env::Default();

  port::Mutex mu;
  MutexLock l(&mu);

  InternalKeyComparator cmp(BytewiseComparator());
  Options options;
  VersionSet vset(dbname, &options, nullptr, &cmp);
  bool save_manifest;
  ASSERT_LEVELDB_OK(vset.Recover(&save_manifest));
  VersionEdit vbase;
  uint64_t fnum = 1;
  for (int i = 0; i < num_base_files; i++) {
    InternalKey start(MakeKey(2 * fnum), 1, kTypeValue);
    InternalKey limit(MakeKey(2 * fnum + 1), 1, kTypeDeletion);
    vbase.AddFile(2, fnum++, 1 /* file size */, start, limit);
  }
  ASSERT_LEVELDB_OK(vset.LogAndApply(&vbase, &mu));

  uint64_t start_micros = env->NowMicros();

  for (int i = 0; i < iters; i++) {
    VersionEdit vedit;
    vedit.RemoveFile(2, fnum);
    InternalKey start(MakeKey(2 * fnum), 1, kTypeValue);
    InternalKey limit(MakeKey(2 * fnum + 1), 1, kTypeDeletion);
    vedit.AddFile(2, fnum++, 1 /* file size */, start, limit);
    vset.LogAndApply(&vedit, &mu);
  }
  uint64_t stop_micros = env->NowMicros();
  unsigned int us = stop_micros - start_micros;
  char buf[16];
  std::snprintf(buf, sizeof(buf), "%d", num_base_files);
  std::fprintf(stderr,
               "BM_LogAndApply/%-6s   %8d iters : %9u us (%7.0f us / iter)\n",
               buf, iters, us, ((float)us) / iters);
}